

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O3

void __thiscall ON_String::CopyArray(ON_String *this)

{
  ON_Internal_Empty_aString *memblock;
  char *s;
  ON_Internal_Empty_aString *pOVar1;
  
  s = this->m_s;
  memblock = (ON_Internal_Empty_aString *)(s + -0xc);
  if ((memblock != &empty_astring && s != (char *)0x0) &&
     (1 < (memblock->header).ref_count.super___atomic_base<int>._M_i)) {
    this->m_s = (char *)0x833064;
    CopyToArray(this,*(int *)(s + -4),s);
    if (*(int *)(s + -8) < *(int *)(s + -4)) {
      pOVar1 = (ON_Internal_Empty_aString *)(this->m_s + -0xc);
      if (this->m_s == (char *)0x0) {
        pOVar1 = &empty_astring;
      }
      (pOVar1->header).string_length = *(int *)(s + -8);
    }
    LOCK();
    (memblock->header).ref_count.super___atomic_base<int>._M_i =
         (memblock->header).ref_count.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((memblock->header).ref_count.super___atomic_base<int>._M_i == 0) {
      s[-8] = '\0';
      s[-7] = '\0';
      s[-6] = '\0';
      s[-5] = '\0';
      s[-4] = '\0';
      s[-3] = '\0';
      s[-2] = '\0';
      s[-1] = '\0';
      onfree(memblock);
      return;
    }
  }
  return;
}

Assistant:

ON_aStringHeader* ON_String::Header() const
{
  ON_aStringHeader* hdr = (ON_aStringHeader*)m_s;
  if (hdr)
    hdr--;
  else
    hdr = &empty_astring.header;
  return hdr;
}